

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

void mpack_write_str(mpack_writer_t *writer,char *data,uint32_t count)

{
  char *pcVar1;
  _Bool _Var2;
  size_t sVar3;
  uint8_t count_00;
  char *p_1;
  char *p;
  size_t size;
  uint32_t count_local;
  char *data_local;
  mpack_writer_t *writer_local;
  
  mpack_writer_track_element(writer);
  count_00 = (uint8_t)count;
  if (count < 0x20) {
    sVar3 = mpack_writer_buffer_left(writer);
    if ((count + 1 <= sVar3) || (_Var2 = mpack_writer_ensure(writer,(ulong)(count + 1)), _Var2)) {
      pcVar1 = writer->current;
      mpack_encode_fixstr(pcVar1,count_00);
      memcpy(pcVar1 + 1,data,(ulong)count);
      writer->current = writer->current + (count + 1);
    }
  }
  else if ((count < 0x100) && (mpack_version_v4 < writer->version)) {
    sVar3 = mpack_writer_buffer_left(writer);
    if (sVar3 < count + 2) {
      sVar3 = mpack_writer_buffer_left(writer);
      if ((1 < sVar3) || (_Var2 = mpack_writer_ensure(writer,2), _Var2)) {
        mpack_encode_str8(writer->current,count_00);
        writer->current = writer->current + 2;
      }
      mpack_write_native(writer,data,(ulong)count);
    }
    else {
      pcVar1 = writer->current;
      mpack_encode_str8(pcVar1,count_00);
      memcpy(pcVar1 + 2,data,(ulong)count);
      writer->current = writer->current + (count + 2);
    }
  }
  else if (count < 0x10000) {
    sVar3 = mpack_writer_buffer_left(writer);
    if ((2 < sVar3) || (_Var2 = mpack_writer_ensure(writer,3), _Var2)) {
      mpack_encode_str16(writer->current,(uint16_t)count);
      writer->current = writer->current + 3;
    }
    mpack_write_native(writer,data,(ulong)count);
  }
  else {
    sVar3 = mpack_writer_buffer_left(writer);
    if ((4 < sVar3) || (_Var2 = mpack_writer_ensure(writer,5), _Var2)) {
      mpack_encode_str32(writer->current,count);
      writer->current = writer->current + 5;
    }
    mpack_write_native(writer,data,(ulong)count);
  }
  return;
}

Assistant:

void mpack_write_str(mpack_writer_t* writer, const char* data, uint32_t count) {
    mpack_assert(data != NULL, "data for string of length %i is NULL", (int)count);

    #if MPACK_OPTIMIZE_FOR_SIZE
    mpack_writer_track_element(writer);
    mpack_start_str_notrack(writer, count);
    mpack_write_native(writer, data, count);
    #else

    mpack_writer_track_element(writer);

    if (count <= 31) {
        // The minimum buffer size when using a flush function is guaranteed to
        // fit the largest possible fixstr.
        size_t size = count + MPACK_TAG_SIZE_FIXSTR;
        if (MPACK_LIKELY(mpack_writer_buffer_left(writer) >= size) || mpack_writer_ensure(writer, size)) {
            char* MPACK_RESTRICT p = writer->current;
            mpack_encode_fixstr(p, (uint8_t)count);
            mpack_memcpy(p + MPACK_TAG_SIZE_FIXSTR, data, count);
            writer->current += count + MPACK_TAG_SIZE_FIXSTR;
        }
        return;
    }

    if (count <= UINT8_MAX
            #if MPACK_COMPATIBILITY
            && writer->version >= mpack_version_v5
            #endif
            ) {
        if (count + MPACK_TAG_SIZE_STR8 <= mpack_writer_buffer_left(writer)) {
            char* MPACK_RESTRICT p = writer->current;
            mpack_encode_str8(p, (uint8_t)count);
            mpack_memcpy(p + MPACK_TAG_SIZE_STR8, data, count);
            writer->current += count + MPACK_TAG_SIZE_STR8;
        } else {
            MPACK_WRITE_ENCODED(mpack_encode_str8, MPACK_TAG_SIZE_STR8, (uint8_t)count);
            mpack_write_native(writer, data, count);
        }
        return;
    }

    // str16 and str32 are likely to be a significant fraction of the buffer
    // size, so we don't bother with a combined space check in order to
    // minimize code size.
    if (count <= UINT16_MAX) {
        MPACK_WRITE_ENCODED(mpack_encode_str16, MPACK_TAG_SIZE_STR16, (uint16_t)count);
        mpack_write_native(writer, data, count);
    } else {
        MPACK_WRITE_ENCODED(mpack_encode_str32, MPACK_TAG_SIZE_STR32, (uint32_t)count);
        mpack_write_native(writer, data, count);
    }

    #endif
}